

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O0

QString * __thiscall QTextCursor::selectedText(QTextCursor *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QTextCursorPrivate *pQVar4;
  QTextTable *pQVar5;
  QString *in_RSI;
  QTextDocumentPrivate *in_RDI;
  long in_FS_OFFSET;
  int cc;
  int cr;
  int cspan;
  int rspan;
  int c;
  int r;
  QTextTable *table;
  QString *text;
  int num_cols;
  int num_rows;
  int col_start;
  int row_start;
  QString docText;
  QTextTableCell cell;
  QTextDocumentPrivate *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  QTextDocumentPrivate *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  int pos;
  QTextDocumentPrivate *priv;
  int local_68;
  int local_64;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  priv = in_RDI;
  bVar1 = QSharedDataPointer<QTextCursorPrivate>::operator!
                    ((QSharedDataPointer<QTextCursorPrivate> *)0x7a4cf2);
  if ((!bVar1) &&
     (pQVar4 = QSharedDataPointer<QTextCursorPrivate>::operator->
                         ((QSharedDataPointer<QTextCursorPrivate> *)0x7a4d00),
     pQVar4->priv != (QTextDocumentPrivate *)0x0)) {
    pQVar4 = QSharedDataPointer<QTextCursorPrivate>::operator->
                       ((QSharedDataPointer<QTextCursorPrivate> *)0x7a4d11);
    pos = pQVar4->position;
    pQVar4 = QSharedDataPointer<QTextCursorPrivate>::operator->
                       ((QSharedDataPointer<QTextCursorPrivate> *)0x7a4d22);
    if (pos != pQVar4->anchor) {
      QSharedDataPointer<QTextCursorPrivate>::operator->
                ((QSharedDataPointer<QTextCursorPrivate> *)0x7a4d74);
      QTextDocumentPrivate::buffer(in_stack_ffffffffffffff48);
      *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&in_RDI->field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&in_RDI->field_0x10 = &DAT_aaaaaaaaaaaaaaaa;
      QString::QString((QString *)0x7a4db4);
      QSharedDataPointer<QTextCursorPrivate>::operator->
                ((QSharedDataPointer<QTextCursorPrivate> *)0x7a4dbe);
      pQVar5 = QTextCursorPrivate::complexSelectionTable
                         ((QTextCursorPrivate *)CONCAT44(pos,in_stack_ffffffffffffff60));
      if (pQVar5 == (QTextTable *)0x0) {
        QSharedDataPointer<QTextCursorPrivate>::operator->
                  ((QSharedDataPointer<QTextCursorPrivate> *)0x7a4fbe);
        selectionStart((QTextCursor *)in_stack_ffffffffffffff58);
        selectionEnd((QTextCursor *)in_stack_ffffffffffffff58);
        getText(in_RSI,priv,(QString *)in_RDI,pos,in_stack_ffffffffffffff60);
      }
      else {
        selectedTableCells((QTextCursor *)priv,(int *)in_RDI,
                           (int *)CONCAT44(pos,in_stack_ffffffffffffff60),
                           (int *)in_stack_ffffffffffffff58,
                           (int *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        for (local_64 = -0x55555556; local_64 < 0x55555554; local_64 = local_64 + 1) {
          for (local_68 = -0x55555556; local_68 < 0x55555554; local_68 = local_68 + 1) {
            local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QTextTable::cellAt((QTextTable *)in_RDI,pos,in_stack_ffffffffffffff60);
            iVar2 = QTextTableCell::rowSpan((QTextTableCell *)in_stack_ffffffffffffff58);
            iVar3 = QTextTableCell::columnSpan((QTextTableCell *)in_stack_ffffffffffffff58);
            if (((iVar2 == 1) ||
                (iVar2 = QTextTableCell::row((QTextTableCell *)in_stack_ffffffffffffff58),
                iVar2 == local_64)) &&
               ((iVar3 == 1 ||
                (iVar2 = QTextTableCell::column((QTextTableCell *)in_stack_ffffffffffffff58),
                iVar2 == local_68)))) {
              pQVar4 = QSharedDataPointer<QTextCursorPrivate>::operator->
                                 ((QSharedDataPointer<QTextCursorPrivate> *)0x7a4f28);
              in_stack_ffffffffffffff58 = pQVar4->priv;
              in_stack_ffffffffffffff60 =
                   QTextTableCell::firstPosition
                             ((QTextTableCell *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
              QTextTableCell::lastPosition
                        ((QTextTableCell *)CONCAT44(pos,in_stack_ffffffffffffff60));
              getText(in_RSI,priv,(QString *)in_RDI,pos,in_stack_ffffffffffffff60);
            }
            QTextTableCell::~QTextTableCell((QTextTableCell *)local_18);
          }
        }
      }
      QString::~QString((QString *)0x7a5026);
      goto LAB_007a5026;
    }
  }
  QString::QString((QString *)0x7a4d38);
LAB_007a5026:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)priv;
  }
  __stack_chk_fail();
}

Assistant:

QString QTextCursor::selectedText() const
{
    if (!d || !d->priv || d->position == d->anchor)
        return QString();

    const QString docText = d->priv->buffer();
    QString text;

    QTextTable *table = d->complexSelectionTable();
    if (table) {
        int row_start, col_start, num_rows, num_cols;
        selectedTableCells(&row_start, &num_rows, &col_start, &num_cols);

        Q_ASSERT(row_start != -1);
        for (int r = row_start; r < row_start + num_rows; ++r) {
            for (int c = col_start; c < col_start + num_cols; ++c) {
                QTextTableCell cell = table->cellAt(r, c);
                int rspan = cell.rowSpan();
                int cspan = cell.columnSpan();
                if (rspan != 1) {
                    int cr = cell.row();
                    if (cr != r)
                        continue;
                }
                if (cspan != 1) {
                    int cc = cell.column();
                    if (cc != c)
                        continue;
                }

                getText(text, d->priv, docText, cell.firstPosition(), cell.lastPosition());
            }
        }
    } else {
        getText(text, d->priv, docText, selectionStart(), selectionEnd());
    }

    return text;
}